

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

String Bstrlib::operator+(uint8 *a,String *b)

{
  uchar *extraout_RDX;
  String SVar1;
  String SStack_28;
  
  String::String(&SStack_28,(char *)b);
  String::operator+((String *)a,&SStack_28);
  String::~String(&SStack_28);
  SVar1.super_tagbstring.data = extraout_RDX;
  SVar1.super_tagbstring._0_8_ = a;
  return (String)SVar1.super_tagbstring;
}

Assistant:

const String operator+(const uint8 * a, const String& b)
    {
        return String((const char *)a) + b;
    }